

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O1

void ourWriteOutJSON(FILE *stream,writeoutvar *mappings,size_t nentries,per_transfer *per,
                    CURLcode per_result)

{
  int iVar1;
  char *in;
  
  fputs("{",(FILE *)stream);
  if (nentries != 0) {
    do {
      if ((mappings->writefunc !=
           (_func_int_FILE_ptr_writeoutvar_ptr_per_transfer_ptr_CURLcode__Bool *)0x0) &&
         (iVar1 = (*mappings->writefunc)(stream,mappings,per,per_result,true), iVar1 != 0)) {
        fputs(",",(FILE *)stream);
      }
      mappings = mappings + 1;
      nentries = nentries - 1;
    } while (nentries != 0);
  }
  curl_mfprintf(stream,"\"curl_version\":");
  in = (char *)curl_version();
  jsonWriteString(stream,in,false);
  curl_mfprintf(stream,"}");
  return;
}

Assistant:

void ourWriteOutJSON(FILE *stream, const struct writeoutvar mappings[],
                     size_t nentries,
                     struct per_transfer *per, CURLcode per_result)
{
  size_t i;

  fputs("{", stream);

  for(i = 0; i < nentries; i++) {
    if(mappings[i].writefunc &&
       mappings[i].writefunc(stream, &mappings[i], per, per_result, true))
      fputs(",", stream);
  }

  /* The variables are sorted in alphabetical order but as a special case
     curl_version (which is not actually a --write-out variable) is last. */
  fprintf(stream, "\"curl_version\":");
  jsonWriteString(stream, curl_version(), FALSE);
  fprintf(stream, "}");
}